

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

shared_ptr<mnf::Manifold> __thiscall RobotManifold::getNewCopy_(RobotManifold *this)

{
  RobotManifold *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RobotManifold *in_RSI;
  shared_ptr<mnf::Manifold> sVar1;
  undefined1 local_28 [8];
  shared_ptr<RobotManifold> copy;
  RobotManifold *this_local;
  
  this_00 = (RobotManifold *)operator_new(0xa0);
  RobotManifold(this_00,in_RSI);
  std::shared_ptr<RobotManifold>::shared_ptr<RobotManifold,void>
            ((shared_ptr<RobotManifold> *)local_28,this_00);
  std::shared_ptr<mnf::Manifold>::shared_ptr<RobotManifold,void>
            ((shared_ptr<mnf::Manifold> *)this,(shared_ptr<RobotManifold> *)local_28);
  std::shared_ptr<RobotManifold>::~shared_ptr((shared_ptr<RobotManifold> *)local_28);
  sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<mnf::Manifold>)
         sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<mnf::Manifold> getNewCopy_() const
  {
    std::shared_ptr<RobotManifold> copy(new RobotManifold(*this));
    return copy;
  }